

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addresses.cpp
# Opt level: O3

UniValue * __thiscall
wallet::DescribeWalletAddressVisitor::operator()
          (UniValue *__return_storage_ptr__,DescribeWalletAddressVisitor *this,WitnessV0KeyHash *id)

{
  SigningProvider *pSVar1;
  string key;
  UniValue val;
  int iVar2;
  size_t sVar3;
  long in_FS_OFFSET;
  Span<const_unsigned_char> s;
  CPubKey pubkey;
  undefined8 in_stack_fffffffffffffed8;
  _Alloc_hider in_stack_fffffffffffffee0;
  size_type in_stack_fffffffffffffee8;
  undefined8 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef8 [16];
  _Alloc_hider in_stack_ffffffffffffff08;
  size_type in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff20 [48];
  long *local_a8 [2];
  long local_98 [2];
  byte local_81 [65];
  undefined1 *local_40;
  undefined8 local_38;
  undefined1 local_30;
  undefined8 local_2f;
  undefined4 local_27;
  undefined2 local_23;
  char local_21;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = &local_30;
  __return_storage_ptr__->typ = VOBJ;
  (__return_storage_ptr__->val)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->val).field_2;
  (__return_storage_ptr__->val).field_2._M_local_buf[0] = '\0';
  *(undefined8 *)((long)&(__return_storage_ptr__->val).field_2 + 1) = local_2f;
  *(undefined4 *)((long)&(__return_storage_ptr__->val).field_2 + 9) = local_27;
  *(undefined2 *)((long)&(__return_storage_ptr__->val).field_2 + 0xd) = local_23;
  (__return_storage_ptr__->val).field_2._M_local_buf[0xf] = local_21;
  (__return_storage_ptr__->val)._M_string_length = 0;
  local_38 = 0;
  local_30 = 0;
  (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_81[0] = 0xff;
  pSVar1 = this->provider;
  if (pSVar1 != (SigningProvider *)0x0) {
    ToKeyID((CKeyID *)&stack0xfffffffffffffee0,id);
    iVar2 = (*pSVar1->_vptr_SigningProvider[4])(pSVar1,&stack0xfffffffffffffee0,local_81);
    if ((char)iVar2 != '\0') {
      local_a8[0] = local_98;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"pubkey","");
      sVar3 = 0x21;
      if ((local_81[0] & 0xfe) != 2) {
        if ((byte)(local_81[0] - 4) < 4) {
          sVar3 = *(size_t *)(&DAT_0049a7a8 + (ulong)(byte)(local_81[0] - 4) * 8);
        }
        else {
          sVar3 = 0;
        }
      }
      s.m_size = sVar3;
      s.m_data = local_81;
      HexStr_abi_cxx11_((string *)&stack0xfffffffffffffee0,s);
      UniValue::
      UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ((UniValue *)&stack0xffffffffffffff00,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xfffffffffffffee0);
      key._M_string_length = (size_type)in_stack_fffffffffffffee0._M_p;
      key._M_dataplus._M_p = (pointer)in_stack_fffffffffffffed8;
      key.field_2._M_allocated_capacity = in_stack_fffffffffffffee8;
      key.field_2._8_8_ = in_stack_fffffffffffffef0;
      val.val._M_string_length = (size_type)in_stack_ffffffffffffff08._M_p;
      val.typ = in_stack_fffffffffffffef8._0_4_;
      val._4_4_ = in_stack_fffffffffffffef8._4_4_;
      val.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffffef8._8_8_;
      val.val.field_2._M_allocated_capacity = in_stack_ffffffffffffff10;
      val.val.field_2._8_8_ = in_stack_ffffffffffffff18;
      val.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data =
           (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )in_stack_ffffffffffffff20._0_24_;
      val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data =
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_ffffffffffffff20._24_24_;
      UniValue::pushKV(__return_storage_ptr__,key,val);
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector
                ((vector<UniValue,_std::allocator<UniValue>_> *)&stack0xffffffffffffff40);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&stack0xffffffffffffff28);
      if (in_stack_ffffffffffffff08._M_p != &stack0xffffffffffffff18) {
        operator_delete(in_stack_ffffffffffffff08._M_p,in_stack_ffffffffffffff18 + 1);
      }
      if (in_stack_fffffffffffffee0._M_p != &stack0xfffffffffffffef0) {
        operator_delete(in_stack_fffffffffffffee0._M_p,in_stack_fffffffffffffef0 + 1);
      }
      if (local_a8[0] != local_98) {
        operator_delete(local_a8[0],local_98[0] + 1);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

UniValue operator()(const WitnessV0KeyHash& id) const
    {
        UniValue obj(UniValue::VOBJ);
        CPubKey pubkey;
        if (provider && provider->GetPubKey(ToKeyID(id), pubkey)) {
            obj.pushKV("pubkey", HexStr(pubkey));
        }
        return obj;
    }